

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_drop.cpp
# Opt level: O3

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::TransformDrop(Transformer *this,PGDropStmt *stmt)

{
  int iVar1;
  long lVar2;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> _Var3;
  char *pcVar4;
  char *pcVar5;
  Transformer *this_00;
  pointer pDVar6;
  ParserException *pPVar7;
  NotImplementedException *pNVar8;
  undefined1 uVar9;
  long in_RDX;
  optional_ptr<duckdb_libpgquery::PGList,_true> view_list;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_60;
  string local_58;
  _Head_base<0UL,_duckdb::DropStatement_*,_false> local_38;
  
  this_00 = (Transformer *)operator_new(0x80);
  DropStatement::DropStatement((DropStatement *)this_00);
  local_38._M_head_impl = (DropStatement *)this_00;
  pDVar6 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
           operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                       *)&local_38);
  lVar2 = *(long *)(in_RDX + 8);
  if (*(int *)(lVar2 + 4) != 1) {
    pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Can only drop one object at a time","");
    NotImplementedException::NotImplementedException(pNVar8,&local_58);
    __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  _Var3._M_head_impl =
       (pDVar6->info).super_unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>.
       _M_t.super___uniq_ptr_impl<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DropInfo_*,_std::default_delete<duckdb::DropInfo>_>.
       super__Head_base<0UL,_duckdb::DropInfo_*,_false>._M_head_impl;
  iVar1 = *(int *)(in_RDX + 0x10);
  if (iVar1 < 0x22) {
    if (iVar1 < 0x15) {
      if (iVar1 == 0x13) {
        uVar9 = 0x1e;
      }
      else {
        if (iVar1 != 0x14) {
LAB_00e8907f:
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Cannot drop this type yet","");
          NotImplementedException::NotImplementedException(pNVar8,&local_58);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        uVar9 = 0x1f;
      }
    }
    else {
      if (iVar1 != 0x15) {
        if (iVar1 != 0x21) goto LAB_00e8907f;
        *(undefined1 *)((long)&(_Var3._M_head_impl)->super_ParseInfo + 9) = 2;
        local_60.ptr = (PGList *)**(long **)(lVar2 + 8);
        optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
        if ((local_60.ptr)->length == 2) {
          optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
          local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->data).ptr_value;
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
          pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
          pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->catalog + 8);
          strlen(pcVar4);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&(_Var3._M_head_impl)->catalog,0,pcVar5,(ulong)pcVar4);
          optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
          local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->next->data).ptr_value;
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
          pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
          pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->name + 8);
          strlen(pcVar4);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&(_Var3._M_head_impl)->name,0,pcVar5,(ulong)pcVar4);
        }
        else {
          optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
          if ((local_60.ptr)->length != 1) {
            pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"Expected \"catalog.schema\" or \"schema\"","");
            ParserException::ParserException(pPVar7,(string *)&local_58);
            __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
          local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->data).ptr_value;
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
          pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
          pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->name + 8);
          strlen(pcVar4);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&(_Var3._M_head_impl)->name,0,pcVar5,(ulong)pcVar4);
        }
        goto LAB_00e88f9f;
      }
      uVar9 = 4;
    }
  }
  else if (iVar1 < 0x2e) {
    if (iVar1 == 0x22) {
      uVar9 = 6;
    }
    else {
      uVar9 = 1;
      if (iVar1 != 0x26) goto LAB_00e8907f;
    }
  }
  else if (iVar1 == 0x2e) {
    uVar9 = 8;
  }
  else {
    if (iVar1 != 0x30) goto LAB_00e8907f;
    uVar9 = 3;
  }
  *(undefined1 *)((long)&(_Var3._M_head_impl)->super_ParseInfo + 9) = uVar9;
  local_60.ptr = (PGList *)**(long **)(lVar2 + 8);
  optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
  if ((local_60.ptr)->length == 3) {
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
    local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->data).ptr_value;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
    pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
    pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->catalog + 8);
    strlen(pcVar4);
    ::std::__cxx11::string::_M_replace((ulong)&(_Var3._M_head_impl)->catalog,0,pcVar5,(ulong)pcVar4)
    ;
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
    local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->next->data).ptr_value;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
    pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
    pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->schema + 8);
    strlen(pcVar4);
    ::std::__cxx11::string::_M_replace((ulong)&(_Var3._M_head_impl)->schema,0,pcVar5,(ulong)pcVar4);
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
    local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->next->next->data).ptr_value;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
    pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
    pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->name + 8);
    strlen(pcVar4);
    ::std::__cxx11::string::_M_replace((ulong)&(_Var3._M_head_impl)->name,0,pcVar5,(ulong)pcVar4);
  }
  else {
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
    if ((local_60.ptr)->length == 2) {
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
      local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->data).ptr_value;
      optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
      pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
      pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->schema + 8);
      strlen(pcVar4);
      ::std::__cxx11::string::_M_replace
                ((ulong)&(_Var3._M_head_impl)->schema,0,pcVar5,(ulong)pcVar4);
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
      local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->next->data).ptr_value;
      optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
      pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
      pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->name + 8);
      strlen(pcVar4);
      ::std::__cxx11::string::_M_replace((ulong)&(_Var3._M_head_impl)->name,0,pcVar5,(ulong)pcVar4);
    }
    else {
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
      if ((local_60.ptr)->length != 1) {
        pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "Expected \"catalog.schema.name\", \"schema.name\"or \"name\"","");
        ParserException::ParserException(pPVar7,(string *)&local_58);
        __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_60);
      local_58._M_dataplus._M_p = (pointer)((local_60.ptr)->head->data).ptr_value;
      optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_58);
      pcVar4 = *(char **)(local_58._M_dataplus._M_p + 8);
      pcVar5 = *(char **)((long)&(_Var3._M_head_impl)->name + 8);
      strlen(pcVar4);
      ::std::__cxx11::string::_M_replace((ulong)&(_Var3._M_head_impl)->name,0,pcVar5,(ulong)pcVar4);
    }
  }
LAB_00e88f9f:
  (_Var3._M_head_impl)->cascade = *(int *)(in_RDX + 0x14) == 1;
  (_Var3._M_head_impl)->if_not_found = *(OnEntryNotFound *)(in_RDX + 0x18);
  (this->parent).ptr = (Transformer *)local_38._M_head_impl;
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
}

Assistant:

unique_ptr<SQLStatement> Transformer::TransformDrop(duckdb_libpgquery::PGDropStmt &stmt) {
	auto result = make_uniq<DropStatement>();
	auto &info = *result->info.get();
	if (stmt.objects->length != 1) {
		throw NotImplementedException("Can only drop one object at a time");
	}
	switch (stmt.removeType) {
	case duckdb_libpgquery::PG_OBJECT_TABLE:
		info.type = CatalogType::TABLE_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_SCHEMA:
		info.type = CatalogType::SCHEMA_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_INDEX:
		info.type = CatalogType::INDEX_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_VIEW:
		info.type = CatalogType::VIEW_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_SEQUENCE:
		info.type = CatalogType::SEQUENCE_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_FUNCTION:
		info.type = CatalogType::MACRO_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_TABLE_MACRO:
		info.type = CatalogType::TABLE_MACRO_ENTRY;
		break;
	case duckdb_libpgquery::PG_OBJECT_TYPE:
		info.type = CatalogType::TYPE_ENTRY;
		break;
	default:
		throw NotImplementedException("Cannot drop this type yet");
	}

	switch (stmt.removeType) {
	case duckdb_libpgquery::PG_OBJECT_SCHEMA: {
		auto view_list = PGPointerCast<duckdb_libpgquery::PGList>(stmt.objects->head->data.ptr_value);
		if (view_list->length == 2) {
			info.catalog = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->next->data.ptr_value)->val.str;
		} else if (view_list->length == 1) {
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
		} else {
			throw ParserException("Expected \"catalog.schema\" or \"schema\"");
		}
		break;
	}
	default: {
		auto view_list = PGPointerCast<duckdb_libpgquery::PGList>(stmt.objects->head->data.ptr_value);
		if (view_list->length == 3) {
			info.catalog = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
			info.schema = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->next->data.ptr_value)->val.str;
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->next->next->data.ptr_value)->val.str;
		} else if (view_list->length == 2) {
			info.schema = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->next->data.ptr_value)->val.str;
		} else if (view_list->length == 1) {
			info.name = PGPointerCast<duckdb_libpgquery::PGValue>(view_list->head->data.ptr_value)->val.str;
		} else {
			throw ParserException("Expected \"catalog.schema.name\", \"schema.name\"or \"name\"");
		}
		break;
	}
	}
	info.cascade = stmt.behavior == duckdb_libpgquery::PGDropBehavior::PG_DROP_CASCADE;
	info.if_not_found = TransformOnEntryNotFound(stmt.missing_ok);
	return std::move(result);
}